

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepTiledBasic.cpp
# Opt level: O2

void anon_unknown.dwarf_106ef0::generateRandomFile
               (int channelCount,Compression compression,bool bulkWrite,bool relativeCoords,
               string *filename)

{
  PixelType PVar1;
  PixelType PVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ostream *poVar12;
  string *psVar13;
  void *pvVar14;
  char *pcVar15;
  int i_1;
  uint uVar16;
  char *pcVar17;
  int j;
  long lVar18;
  uint l;
  ulong uVar19;
  ulong uVar20;
  int i;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int j_1;
  long lVar25;
  float fVar26;
  int local_30c;
  long local_308;
  Array<Imf_3_2::Array2D<void_*>_> data;
  DeepTiledOutputFile file;
  int local_2ac;
  Array2D<unsigned_int> sampleCount;
  Box2i box;
  int type;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  undefined1 local_1a8 [376];
  
  if (bulkWrite && relativeCoords) {
    __assert_fail("bulkWrite == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x3c,
                  "void (anonymous namespace)::generateRandomFile(int, Compression, bool, bool, const std::string &)"
                 );
  }
  std::operator<<((ostream *)&std::cout,"generating ");
  std::ostream::flush();
  frameBuffer._map._M_t._M_impl._0_8_ = 0;
  Imf_3_2::Header::Header
            ((Header *)&ss,(Box *)(anonymous_namespace)::displayWindow,
             (Box *)&(anonymous_namespace)::dataWindow,1.0,(Vec2 *)&frameBuffer,1.0,INCREASING_Y,
             compression);
  Imf_3_2::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
  Imf_3_2::Header::~Header((Header *)&ss);
  poVar12 = std::operator<<((ostream *)&std::cout,"compression ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,compression);
  std::operator<<(poVar12," ");
  std::ostream::flush();
  if (DAT_001d75e8 != (anonymous_namespace)::channelTypes) {
    DAT_001d75e8 = (anonymous_namespace)::channelTypes;
  }
  uVar16 = 0;
  uVar4 = 0;
  if (0 < channelCount) {
    uVar4 = channelCount;
  }
  for (; uVar4 != uVar16; uVar16 = uVar16 + 1) {
    type = random_int(3);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::operator<<(local_1a8,uVar16);
    std::__cxx11::stringbuf::str();
    if (type == 0) {
      psVar13 = (string *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&box,UINT,1,1,false);
      Imf_3_2::ChannelList::insert(psVar13,(Channel *)&frameBuffer);
    }
    if (type == 1) {
      psVar13 = (string *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&box,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(psVar13,(Channel *)&frameBuffer);
    }
    if (type == 2) {
      psVar13 = (string *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&box,FLOAT,1,1,false);
      Imf_3_2::ChannelList::insert(psVar13,(Channel *)&frameBuffer);
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::channelTypes,&type);
    std::__cxx11::string::~string((string *)&frameBuffer);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  Imf_3_2::Header::setType((string *)(anonymous_namespace)::header);
  iVar5 = random_int(0x111);
  iVar6 = random_int(0xa9);
  iVar6 = iVar6 + 1;
  _ss = iVar5 + 1;
  Imf_3_2::Header::setTileDescription((TileDescription *)(anonymous_namespace)::header);
  remove((filename->_M_dataplus)._M_p);
  Imf_3_2::DeepTiledOutputFile::DeepTiledOutputFile
            (&file,(filename->_M_dataplus)._M_p,(Header *)(anonymous_namespace)::header,8);
  Imf_3_2::DeepFrameBuffer::DeepFrameBuffer(&frameBuffer);
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array(&data,(ulong)(uint)channelCount);
  uVar3 = (ulong)uVar4;
  for (lVar21 = 0; uVar3 * 0x18 - lVar21 != 0; lVar21 = lVar21 + 0x18) {
    Imf_3_2::Array2D<void_*>::resizeErase
              ((Array2D<void_*> *)((long)&(data._data)->_sizeX + lVar21),0xa9,0x111);
  }
  sampleCount._sizeX = 0;
  sampleCount._sizeY = 0;
  sampleCount._data = (uint *)0x0;
  Imf_3_2::Array2D<unsigned_int>::resizeErase(&sampleCount,0xa9,0x111);
  poVar12 = std::operator<<((ostream *)&std::cout," tileSizeX ");
  Imf_3_2::DeepTiledOutputFile::tileXSize();
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12," tileSizeY ");
  Imf_3_2::DeepTiledOutputFile::tileYSize();
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::operator<<(poVar12," ");
  iVar5 = Imf_3_2::DeepTiledOutputFile::numYLevels();
  iVar7 = Imf_3_2::DeepTiledOutputFile::numXLevels();
  Imf_3_2::Array2D<Imf_3_2::Array2D<unsigned_int>_>::resizeErase
            ((Array2D<Imf_3_2::Array2D<unsigned_int>_> *)&(anonymous_namespace)::sampleCountWhole,
             (long)iVar5,(long)iVar7);
  lVar21 = 0;
  for (lVar22 = 0; lVar22 < (anonymous_namespace)::sampleCountWhole; lVar22 = lVar22 + 1) {
    lVar25 = 0;
    for (lVar18 = 0; lVar18 < DAT_001d7600; lVar18 = lVar18 + 1) {
      Imf_3_2::Array2D<unsigned_int>::resizeErase
                ((Array2D<unsigned_int> *)(DAT_001d7600 * lVar21 + DAT_001d7608 + lVar25),0xa9,0x111
                );
      lVar25 = lVar25 + 0x18;
    }
    lVar21 = lVar21 + 0x18;
  }
  if (relativeCoords) {
    lVar21 = 0;
  }
  else {
    lVar21 = (long)DAT_001d75c4 * 0x111 + (long)(anonymous_namespace)::dataWindow;
  }
  Imf_3_2::Slice::Slice
            ((Slice *)&ss,UINT,(char *)(sampleCount._data + -lVar21),4,0x444,1,1,0.0,relativeCoords,
             relativeCoords);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  lVar22 = 0x10;
  for (uVar19 = 0; uVar3 != uVar19; uVar19 = uVar19 + 1) {
    PVar1 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar19 * 4);
    PVar2 = (uint)(PVar1 != UINT) * 3;
    if (PVar1 == HALF) {
      PVar2 = PVar1;
    }
    if (PVar1 == FLOAT) {
      PVar2 = PVar1;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::operator<<(local_1a8,(int)uVar19);
    std::__cxx11::stringbuf::str();
    iVar5 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
    uVar20 = (ulong)(iVar5 == 0) << 2;
    if (iVar5 == 1) {
      uVar20 = 2;
    }
    if (iVar5 == 2) {
      uVar20 = 4;
    }
    Imf_3_2::DeepSlice::DeepSlice
              ((DeepSlice *)&box,PVar2,
               (char *)(*(long *)((long)&(data._data)->_sizeX + lVar22) + lVar21 * -8),8,0x888,
               uVar20,1,1,0.0,relativeCoords,relativeCoords);
    Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&type);
    std::__cxx11::string::~string((string *)&type);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    lVar22 = lVar22 + 0x18;
  }
  Imf_3_2::DeepTiledOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::flush();
  pcVar15 = "per-tile ";
  if (relativeCoords) {
    pcVar15 = "per-tile with relative coordinates ";
  }
  pcVar17 = "bulk ";
  if (!bulkWrite) {
    pcVar17 = pcVar15;
  }
  std::operator<<((ostream *)&std::cout,pcVar17);
  std::ostream::flush();
  local_308 = 0;
  do {
    iVar5 = Imf_3_2::DeepTiledOutputFile::numYLevels();
    if (iVar5 <= local_308) {
      Imf_3_2::Array2D<unsigned_int>::~Array2D(&sampleCount);
      Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array(&data);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_3_2::DeepTiledOutputFile::~DeepTiledOutputFile(&file);
      return;
    }
    lVar21 = 0;
    while( true ) {
      iVar5 = Imf_3_2::DeepTiledOutputFile::numXLevels();
      if (iVar5 <= lVar21) break;
      Imf_3_2::DeepTiledOutputFile::dataWindowForLevel((int)&ss,(int)&file);
      iVar5 = (int)lVar21;
      if (bulkWrite) {
        local_2ac = 0;
        while( true ) {
          iVar8 = (int)&file;
          iVar7 = Imf_3_2::DeepTiledOutputFile::numYTiles(iVar8);
          if (iVar7 <= local_2ac) break;
          iVar7 = 0;
          while( true ) {
            iVar8 = Imf_3_2::DeepTiledOutputFile::numXTiles((int)&file);
            if (iVar8 <= iVar7) break;
            Imf_3_2::DeepTiledOutputFile::dataWindowForTile((int)&box,(int)&file,iVar7,local_2ac);
            for (iVar8 = box.min.y; iVar8 <= box.max.y; iVar8 = iVar8 + 1) {
              for (iVar11 = box.min.x; iVar11 <= box.max.x; iVar11 = iVar11 + 1) {
                lVar18 = (long)_ss;
                iVar9 = random_int(10);
                lVar18 = iVar11 - lVar18;
                lVar25 = (long)iVar8 - (long)iVar6;
                sampleCount._data[sampleCount._sizeY * lVar25 + lVar18] = iVar9 + 1U;
                lVar22 = DAT_001d7600 * local_308 * 0x18 + DAT_001d7608;
                *(uint *)(*(long *)(lVar21 * 0x18 + 8 + lVar22) * lVar25 * 4 +
                          *(long *)(lVar21 * 0x18 + 0x10 + lVar22) + lVar18 * 4) = iVar9 + 1U;
                iVar9 = ((int)lVar25 * 0x111 + (int)lVar18) % 0x801;
                fVar26 = (float)iVar9;
                lVar22 = sampleCount._sizeY;
                for (uVar19 = 0; uVar19 != uVar3; uVar19 = uVar19 + 1) {
                  iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                  if (iVar10 == 0) {
                    pvVar14 = operator_new__((ulong)sampleCount._data[lVar22 * lVar25 + lVar18] << 2
                                            );
                    data._data[uVar19]._data[data._data[uVar19]._sizeY * lVar25 + lVar18] = pvVar14;
                    iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                  }
                  if (iVar10 == 1) {
                    pvVar14 = operator_new__((ulong)sampleCount._data[lVar22 * lVar25 + lVar18] * 2)
                    ;
                    data._data[uVar19]._data[data._data[uVar19]._sizeY * lVar25 + lVar18] = pvVar14;
                    iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                  }
                  if (iVar10 == 2) {
                    pvVar14 = operator_new__((ulong)sampleCount._data[lVar22 * lVar25 + lVar18] << 2
                                            );
                    data._data[uVar19]._data[data._data[uVar19]._sizeY * lVar25 + lVar18] = pvVar14;
                  }
                  lVar23 = 0;
                  for (uVar20 = 0; lVar24 = (anonymous_namespace)::channelTypes,
                      uVar20 < sampleCount._data[lVar22 * lVar25 + lVar18]; uVar20 = uVar20 + 1) {
                    iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                    if (iVar10 == 0) {
                      *(int *)((long)data._data[uVar19]._data
                                     [data._data[uVar19]._sizeY * lVar25 + lVar18] + lVar23 * 2) =
                           iVar9;
                      iVar10 = *(int *)(lVar24 + uVar19 * 4);
                    }
                    if (iVar10 == 1) {
                      Imath_3_2::half::operator=
                                ((half *)((long)data._data[uVar19]._data
                                                [data._data[uVar19]._sizeY * lVar25 + lVar18] +
                                         lVar23),fVar26);
                      iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                    }
                    if (iVar10 == 2) {
                      *(float *)((long)data._data[uVar19]._data
                                       [data._data[uVar19]._sizeY * lVar25 + lVar18] + lVar23 * 2) =
                           fVar26;
                    }
                    lVar23 = lVar23 + 2;
                    lVar22 = sampleCount._sizeY;
                  }
                }
              }
            }
            iVar7 = iVar7 + 1;
          }
          local_2ac = local_2ac + 1;
        }
        iVar7 = Imf_3_2::DeepTiledOutputFile::numXTiles(iVar8);
        iVar11 = Imf_3_2::DeepTiledOutputFile::numYTiles(iVar8);
        Imf_3_2::DeepTiledOutputFile::writeTiles(iVar8,0,iVar7 + -1,0,iVar11 + -1,iVar5);
      }
      else if (relativeCoords) {
        for (local_30c = 0; iVar7 = Imf_3_2::DeepTiledOutputFile::numYTiles((int)&file),
            local_30c < iVar7; local_30c = local_30c + 1) {
          iVar7 = 0;
          while( true ) {
            iVar8 = Imf_3_2::DeepTiledOutputFile::numXTiles((int)&file);
            if (iVar8 <= iVar7) break;
            Imf_3_2::DeepTiledOutputFile::dataWindowForTile((int)&box,(int)&file,iVar7,local_30c);
            for (iVar8 = box.min.y; iVar11 = box.min.x, iVar8 <= box.max.y; iVar8 = iVar8 + 1) {
              for (; iVar11 <= box.max.x; iVar11 = iVar11 + 1) {
                lVar22 = (long)_ss;
                lVar24 = (long)box.min.y;
                lVar18 = (long)box.min.x;
                iVar9 = random_int(10);
                lVar22 = iVar11 - lVar22;
                lVar25 = (long)iVar8 - (long)iVar6;
                lVar18 = iVar11 - lVar18;
                lVar24 = iVar8 - lVar24;
                sampleCount._data[sampleCount._sizeY * lVar24 + lVar18] = iVar9 + 1U;
                lVar23 = DAT_001d7600 * local_308 * 0x18 + DAT_001d7608;
                *(uint *)(lVar25 * *(long *)(lVar21 * 0x18 + 8 + lVar23) * 4 +
                          *(long *)(lVar21 * 0x18 + 0x10 + lVar23) + lVar22 * 4) = iVar9 + 1U;
                iVar9 = ((int)lVar25 * 0x111 + (int)lVar22) % 0x801;
                fVar26 = (float)iVar9;
                lVar22 = sampleCount._sizeY;
                for (uVar19 = 0; uVar19 != uVar3; uVar19 = uVar19 + 1) {
                  iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                  if (iVar10 == 0) {
                    pvVar14 = operator_new__((ulong)sampleCount._data[lVar22 * lVar24 + lVar18] << 2
                                            );
                    data._data[uVar19]._data[data._data[uVar19]._sizeY * lVar24 + lVar18] = pvVar14;
                    iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                  }
                  if (iVar10 == 1) {
                    pvVar14 = operator_new__((ulong)sampleCount._data[lVar22 * lVar24 + lVar18] * 2)
                    ;
                    data._data[uVar19]._data[data._data[uVar19]._sizeY * lVar24 + lVar18] = pvVar14;
                    iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                  }
                  if (iVar10 == 2) {
                    pvVar14 = operator_new__((ulong)sampleCount._data[lVar22 * lVar24 + lVar18] << 2
                                            );
                    data._data[uVar19]._data[data._data[uVar19]._sizeY * lVar24 + lVar18] = pvVar14;
                  }
                  lVar25 = 0;
                  for (uVar20 = 0; lVar23 = (anonymous_namespace)::channelTypes,
                      uVar20 < sampleCount._data[lVar22 * lVar24 + lVar18]; uVar20 = uVar20 + 1) {
                    iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                    if (iVar10 == 0) {
                      *(int *)((long)data._data[uVar19]._data
                                     [data._data[uVar19]._sizeY * lVar24 + lVar18] + lVar25 * 2) =
                           iVar9;
                      iVar10 = *(int *)(lVar23 + uVar19 * 4);
                    }
                    if (iVar10 == 1) {
                      Imath_3_2::half::operator=
                                ((half *)((long)data._data[uVar19]._data
                                                [data._data[uVar19]._sizeY * lVar24 + lVar18] +
                                         lVar25),fVar26);
                      iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                    }
                    if (iVar10 == 2) {
                      *(float *)((long)data._data[uVar19]._data
                                       [data._data[uVar19]._sizeY * lVar24 + lVar18] + lVar25 * 2) =
                           fVar26;
                    }
                    lVar25 = lVar25 + 2;
                    lVar22 = sampleCount._sizeY;
                  }
                }
              }
            }
            Imf_3_2::DeepTiledOutputFile::writeTile((int)&file,iVar7,local_30c,iVar5);
            for (iVar8 = box.min.y; iVar11 = box.min.x, iVar8 <= box.max.y; iVar8 = iVar8 + 1) {
              for (; iVar11 <= box.max.x; iVar11 = iVar11 + 1) {
                lVar22 = 4;
                for (uVar19 = 0; uVar3 != uVar19; uVar19 = uVar19 + 1) {
                  lVar18 = (long)box.min.y;
                  lVar25 = (long)box.min.x;
                  iVar9 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                  if (iVar9 == 0) {
                    pvVar14 = *(void **)(*(long *)((long)data._data + lVar22 * 4 + -8) *
                                         (iVar8 - lVar18) * 8 +
                                         *(long *)((long)&(data._data)->_sizeX + lVar22 * 4) +
                                        (iVar11 - lVar25) * 8);
                    if (pvVar14 != (void *)0x0) {
                      operator_delete__(pvVar14);
                      iVar9 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                      goto LAB_0014aa09;
                    }
                  }
                  else {
LAB_0014aa09:
                    lVar23 = (long)(int)(iVar8 - lVar18);
                    lVar18 = (long)(int)(iVar11 - lVar25);
                    if (iVar9 == 1) {
                      pvVar14 = *(void **)(*(long *)((long)data._data + lVar22 * 4 + -8) * lVar23 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar22 * 4) +
                                          lVar18 * 8);
                      if (pvVar14 == (void *)0x0) goto LAB_0014aa69;
                      operator_delete__(pvVar14);
                      iVar9 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                    }
                    if ((iVar9 == 2) &&
                       (pvVar14 = *(void **)(lVar23 * *(long *)((long)data._data + lVar22 * 4 + -8)
                                             * 8 + *(long *)((long)&(data._data)->_sizeX +
                                                            lVar22 * 4) + lVar18 * 8),
                       pvVar14 != (void *)0x0)) {
                      operator_delete__(pvVar14);
                    }
                  }
LAB_0014aa69:
                  lVar22 = lVar22 + 6;
                }
              }
            }
            iVar7 = iVar7 + 1;
          }
        }
      }
      else {
        for (local_30c = 0; iVar7 = Imf_3_2::DeepTiledOutputFile::numYTiles((int)&file),
            local_30c < iVar7; local_30c = local_30c + 1) {
          iVar7 = 0;
          while( true ) {
            iVar8 = Imf_3_2::DeepTiledOutputFile::numXTiles((int)&file);
            if (iVar8 <= iVar7) break;
            Imf_3_2::DeepTiledOutputFile::dataWindowForTile((int)&box,(int)&file,iVar7,local_30c);
            for (iVar8 = box.min.y; iVar11 = box.min.x, iVar8 <= box.max.y; iVar8 = iVar8 + 1) {
              for (; iVar11 <= box.max.x; iVar11 = iVar11 + 1) {
                lVar18 = (long)_ss;
                iVar9 = random_int(10);
                lVar18 = iVar11 - lVar18;
                lVar25 = (long)iVar8 - (long)iVar6;
                sampleCount._data[sampleCount._sizeY * lVar25 + lVar18] = iVar9 + 1U;
                lVar22 = DAT_001d7600 * local_308 * 0x18 + DAT_001d7608;
                *(uint *)(*(long *)(lVar21 * 0x18 + 8 + lVar22) * lVar25 * 4 +
                          *(long *)(lVar21 * 0x18 + 0x10 + lVar22) + lVar18 * 4) = iVar9 + 1U;
                iVar9 = ((int)lVar25 * 0x111 + (int)lVar18) % 0x801;
                fVar26 = (float)iVar9;
                lVar22 = sampleCount._sizeY;
                for (uVar19 = 0; uVar19 != uVar3; uVar19 = uVar19 + 1) {
                  iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                  if (iVar10 == 0) {
                    pvVar14 = operator_new__((ulong)sampleCount._data[lVar22 * lVar25 + lVar18] << 2
                                            );
                    data._data[uVar19]._data[data._data[uVar19]._sizeY * lVar25 + lVar18] = pvVar14;
                    iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                  }
                  if (iVar10 == 1) {
                    pvVar14 = operator_new__((ulong)sampleCount._data[lVar22 * lVar25 + lVar18] * 2)
                    ;
                    data._data[uVar19]._data[data._data[uVar19]._sizeY * lVar25 + lVar18] = pvVar14;
                    iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                  }
                  if (iVar10 == 2) {
                    pvVar14 = operator_new__((ulong)sampleCount._data[lVar22 * lVar25 + lVar18] << 2
                                            );
                    data._data[uVar19]._data[data._data[uVar19]._sizeY * lVar25 + lVar18] = pvVar14;
                  }
                  lVar23 = 0;
                  for (uVar20 = 0; lVar24 = (anonymous_namespace)::channelTypes,
                      uVar20 < sampleCount._data[lVar22 * lVar25 + lVar18]; uVar20 = uVar20 + 1) {
                    iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                    if (iVar10 == 0) {
                      *(int *)((long)data._data[uVar19]._data
                                     [data._data[uVar19]._sizeY * lVar25 + lVar18] + lVar23 * 2) =
                           iVar9;
                      iVar10 = *(int *)(lVar24 + uVar19 * 4);
                    }
                    if (iVar10 == 1) {
                      Imath_3_2::half::operator=
                                ((half *)((long)data._data[uVar19]._data
                                                [data._data[uVar19]._sizeY * lVar25 + lVar18] +
                                         lVar23),fVar26);
                      iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                    }
                    if (iVar10 == 2) {
                      *(float *)((long)data._data[uVar19]._data
                                       [data._data[uVar19]._sizeY * lVar25 + lVar18] + lVar23 * 2) =
                           fVar26;
                    }
                    lVar23 = lVar23 + 2;
                    lVar22 = sampleCount._sizeY;
                  }
                }
              }
            }
            Imf_3_2::DeepTiledOutputFile::writeTile((int)&file,iVar7,local_30c,iVar5);
            iVar7 = iVar7 + 1;
          }
        }
      }
      if (!relativeCoords) {
        for (lVar22 = 0; iVar5 = Imf_3_2::DeepTiledOutputFile::levelHeight((int)&file),
            lVar22 < iVar5; lVar22 = lVar22 + 1) {
          for (lVar18 = 0; iVar5 = Imf_3_2::DeepTiledOutputFile::levelWidth((int)&file),
              lVar18 < iVar5; lVar18 = lVar18 + 1) {
            lVar25 = 4;
            for (uVar19 = 0; uVar3 != uVar19; uVar19 = uVar19 + 1) {
              iVar5 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
              if (iVar5 == 0) {
                pvVar14 = *(void **)(*(long *)((long)data._data + lVar25 * 4 + -8) * lVar22 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar25 * 4) +
                                    lVar18 * 8);
                if (pvVar14 != (void *)0x0) {
                  operator_delete__(pvVar14);
                  iVar5 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                  goto LAB_0014aebd;
                }
              }
              else {
LAB_0014aebd:
                if (iVar5 == 1) {
                  pvVar14 = *(void **)(*(long *)((long)data._data + lVar25 * 4 + -8) * lVar22 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar25 * 4) +
                                      lVar18 * 8);
                  if (pvVar14 == (void *)0x0) goto LAB_0014af1a;
                  operator_delete__(pvVar14);
                  iVar5 = *(int *)((anonymous_namespace)::channelTypes + uVar19 * 4);
                }
                if ((iVar5 == 2) &&
                   (pvVar14 = *(void **)(*(long *)((long)data._data + lVar25 * 4 + -8) * lVar22 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar25 * 4) +
                                        lVar18 * 8), pvVar14 != (void *)0x0)) {
                  operator_delete__(pvVar14);
                }
              }
LAB_0014af1a:
              lVar25 = lVar25 + 6;
            }
          }
        }
      }
      lVar21 = lVar21 + 1;
    }
    local_308 = local_308 + 1;
  } while( true );
}

Assistant:

void
generateRandomFile (
    int                channelCount,
    Compression        compression,
    bool               bulkWrite,
    bool               relativeCoords,
    const std::string& filename)
{
    if (relativeCoords) assert (bulkWrite == false);

    cout << "generating " << flush;
    header = Header (
        displayWindow,
        dataWindow,
        1,
        IMATH_NAMESPACE::V2f (0, 0),
        1,
        INCREASING_Y,
        compression);
    cout << "compression " << compression << " " << flush;

    //
    // Add channels.
    //

    channelTypes.clear ();

    for (int i = 0; i < channelCount; i++)
    {
        int          type = random_int (3);
        stringstream ss;
        ss << i;
        string str = ss.str ();
        if (type == 0) header.channels ().insert (str, Channel (IMF::UINT));
        if (type == 1) header.channels ().insert (str, Channel (IMF::HALF));
        if (type == 2) header.channels ().insert (str, Channel (IMF::FLOAT));
        channelTypes.push_back (type);
    }

    header.setType (DEEPTILE);
    header.setTileDescription (TileDescription (
        random_int (width) + 1, random_int (height) + 1, RIPMAP_LEVELS));

    //
    // Set up the output file
    //
    remove (filename.c_str ());
    DeepTiledOutputFile file (filename.c_str (), header, 8);

    DeepFrameBuffer frameBuffer;

    Array<Array2D<void*>> data (channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase (height, width);

    Array2D<unsigned int> sampleCount;
    sampleCount.resizeErase (height, width);

    cout << " tileSizeX " << file.tileXSize () << " tileSizeY "
         << file.tileYSize () << " ";

    sampleCountWhole.resizeErase (file.numYLevels (), file.numXLevels ());
    for (int i = 0; i < sampleCountWhole.height (); i++)
        for (int j = 0; j < sampleCountWhole.width (); j++)
            sampleCountWhole[i][j].resizeErase (height, width);

    int memOffset;
    if (relativeCoords)
        memOffset = 0;
    else
        memOffset = dataWindow.min.x + dataWindow.min.y * width;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT,
        (char*) (&sampleCount[0][0] - memOffset),
        sizeof (unsigned int) * 1,
        sizeof (unsigned int) * width,
        1,
        1,
        0,
        relativeCoords,
        relativeCoords));

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0) type = IMF::UINT;
        if (channelTypes[i] == 1) type = IMF::HALF;
        if (channelTypes[i] == 2) type = IMF::FLOAT;

        stringstream ss;
        ss << i;
        string str = ss.str ();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof (char*);

        frameBuffer.insert (
            str,
            DeepSlice (
                type,
                (char*) (&data[i][0][0] - memOffset),
                pointerSize * 1,
                pointerSize * width,
                sampleSize,
                1,
                1,
                0,
                relativeCoords,
                relativeCoords));
    }

    file.setFrameBuffer (frameBuffer);

    cout << "writing " << flush;

    if (bulkWrite)
        cout << "bulk " << flush;
    else
    {
        if (relativeCoords == false)
            cout << "per-tile " << flush;
        else
            cout << "per-tile with relative coordinates " << flush;
    }

    for (int ly = 0; ly < file.numYLevels (); ly++)
        for (int lx = 0; lx < file.numXLevels (); lx++)
        {
            Box2i dataWindowL = file.dataWindowForLevel (lx, ly);

            if (bulkWrite)
            {
                //
                // Bulk write (without relative coordinates).
                //

                for (int j = 0; j < file.numYTiles (ly); j++)
                {
                    for (int i = 0; i < file.numXTiles (lx); i++)
                    {
                        Box2i box = file.dataWindowForTile (i, j, lx, ly);
                        for (int y = box.min.y; y <= box.max.y; y++)
                            for (int x = box.min.x; x <= box.max.x; x++)
                            {
                                int dwy               = y - dataWindowL.min.y;
                                int dwx               = x - dataWindowL.min.x;
                                sampleCount[dwy][dwx] = random_int (10) + 1;
                                sampleCountWhole[ly][lx][dwy][dwx] =
                                    sampleCount[dwy][dwx];
                                for (int k = 0; k < channelCount; k++)
                                {
                                    if (channelTypes[k] == 0)
                                        data[k][dwy][dwx] =
                                            new unsigned int[sampleCount[dwy]
                                                                        [dwx]];
                                    if (channelTypes[k] == 1)
                                        data[k][dwy][dwx] =
                                            new half[sampleCount[dwy][dwx]];
                                    if (channelTypes[k] == 2)
                                        data[k][dwy][dwx] =
                                            new float[sampleCount[dwy][dwx]];
                                    for (unsigned int l = 0;
                                         l < sampleCount[dwy][dwx];
                                         l++)
                                    {
                                        if (channelTypes[k] == 0)
                                            ((unsigned int*)
                                                 data[k][dwy][dwx])[l] =
                                                (dwy * width + dwx) % 2049;
                                        if (channelTypes[k] == 1)
                                            ((half*) data[k][dwy][dwx])[l] =
                                                (dwy * width + dwx) % 2049;
                                        if (channelTypes[k] == 2)
                                            ((float*) data[k][dwy][dwx])[l] =
                                                (dwy * width + dwx) % 2049;
                                    }
                                }
                            }
                    }
                }

                file.writeTiles (
                    0,
                    file.numXTiles (lx) - 1,
                    0,
                    file.numYTiles (ly) - 1,
                    lx,
                    ly);
            }
            else if (bulkWrite == false)
            {
                if (relativeCoords == false)
                {
                    //
                    // Per-tile write without relative coordinates.
                    //

                    for (int j = 0; j < file.numYTiles (ly); j++)
                    {
                        for (int i = 0; i < file.numXTiles (lx); i++)
                        {
                            Box2i box = file.dataWindowForTile (i, j, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    sampleCount[dwy][dwx] = random_int (10) + 1;
                                    sampleCountWhole[ly][lx][dwy][dwx] =
                                        sampleCount[dwy][dwx];
                                    for (int k = 0; k < channelCount; k++)
                                    {
                                        if (channelTypes[k] == 0)
                                            data[k][dwy][dwx] = new unsigned int
                                                [sampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 1)
                                            data[k][dwy][dwx] =
                                                new half[sampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 2)
                                            data[k][dwy][dwx] =
                                                new float[sampleCount[dwy]
                                                                     [dwx]];
                                        for (unsigned int l = 0;
                                             l < sampleCount[dwy][dwx];
                                             l++)
                                        {
                                            if (channelTypes[k] == 0)
                                                ((unsigned int*)
                                                     data[k][dwy][dwx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                            if (channelTypes[k] == 1)
                                                ((half*) data[k][dwy][dwx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                            if (channelTypes[k] == 2)
                                                ((float*)
                                                     data[k][dwy][dwx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                        }
                                    }
                                }
                            file.writeTile (i, j, lx, ly);
                        }
                    }
                }
                else if (relativeCoords)
                {
                    //
                    // Per-tile write with relative coordinates.
                    //

                    for (int j = 0; j < file.numYTiles (ly); j++)
                    {
                        for (int i = 0; i < file.numXTiles (lx); i++)
                        {
                            Box2i box = file.dataWindowForTile (i, j, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy             = y - dataWindowL.min.y;
                                    int dwx             = x - dataWindowL.min.x;
                                    int ty              = y - box.min.y;
                                    int tx              = x - box.min.x;
                                    sampleCount[ty][tx] = random_int (10) + 1;
                                    sampleCountWhole[ly][lx][dwy][dwx] =
                                        sampleCount[ty][tx];
                                    for (int k = 0; k < channelCount; k++)
                                    {
                                        if (channelTypes[k] == 0)
                                            data[k][ty][tx] = new unsigned int
                                                [sampleCount[ty][tx]];
                                        if (channelTypes[k] == 1)
                                            data[k][ty][tx] =
                                                new half[sampleCount[ty][tx]];
                                        if (channelTypes[k] == 2)
                                            data[k][ty][tx] =
                                                new float[sampleCount[ty][tx]];
                                        for (unsigned int l = 0;
                                             l < sampleCount[ty][tx];
                                             l++)
                                        {
                                            if (channelTypes[k] == 0)
                                                ((unsigned int*)
                                                     data[k][ty][tx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                            if (channelTypes[k] == 1)
                                                ((half*) data[k][ty][tx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                            if (channelTypes[k] == 2)
                                                ((float*) data[k][ty][tx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                        }
                                    }
                                }
                            file.writeTile (i, j, lx, ly);

                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                    for (int k = 0; k < channelCount; k++)
                                    {
                                        int ty = y - box.min.y;
                                        int tx = x - box.min.x;
                                        if (channelTypes[k] == 0)
                                            delete[](unsigned int*)
                                                data[k][ty][tx];
                                        if (channelTypes[k] == 1)
                                            delete[](half*) data[k][ty][tx];
                                        if (channelTypes[k] == 2)
                                            delete[](float*) data[k][ty][tx];
                                    }
                        }
                    }
                }
            }

            if (relativeCoords == false)
            {
                for (int i = 0; i < file.levelHeight (ly); i++)
                    for (int j = 0; j < file.levelWidth (lx); j++)
                        for (int k = 0; k < channelCount; k++)
                        {
                            if (channelTypes[k] == 0)
                                delete[](unsigned int*) data[k][i][j];
                            if (channelTypes[k] == 1)
                                delete[](half*) data[k][i][j];
                            if (channelTypes[k] == 2)
                                delete[](float*) data[k][i][j];
                        }
            }
        }
}